

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void print_decl_spec(c2m_ctx_t c2m_ctx,FILE *f,decl_spec *decl_spec)

{
  char *pcVar1;
  
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x1) !=
      (undefined1  [32])0x0) {
    fwrite(" typedef, ",10,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x2) !=
      (undefined1  [32])0x0) {
    fwrite(" extern, ",9,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x4) !=
      (undefined1  [32])0x0) {
    fwrite(" static, ",9,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x8) !=
      (undefined1  [32])0x0) {
    fwrite(" auto, ",7,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x10) !=
      (undefined1  [32])0x0) {
    fwrite(" register, ",0xb,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x20) !=
      (undefined1  [32])0x0) {
    fwrite(" thread local, ",0xf,1,(FILE *)f);
  }
  if ((undefined1  [32])((undefined1  [32])*decl_spec & (undefined1  [32])0x40) !=
      (undefined1  [32])0x0) {
    fwrite(" inline, ",9,1,(FILE *)f);
  }
  if (*(char *)decl_spec < '\0') {
    fwrite(" no return, ",0xc,1,(FILE *)f);
  }
  if (-1 < decl_spec->align) {
    fprintf((FILE *)f," align = %d, ");
  }
  if (decl_spec->align_node != (node_t_conflict)0x0) {
    fprintf((FILE *)f," strictest align node %u, ",(ulong)decl_spec->align_node->uid);
  }
  if (decl_spec->linkage != N_IGNORE) {
    pcVar1 = "extern";
    if (decl_spec->linkage == N_STATIC) {
      pcVar1 = "static";
    }
    fprintf((FILE *)f," %s linkage, ",pcVar1);
  }
  print_type(c2m_ctx,f,decl_spec->type);
  return;
}

Assistant:

static void print_decl_spec (c2m_ctx_t c2m_ctx, FILE *f, struct decl_spec *decl_spec) {
  if (decl_spec->typedef_p) fprintf (f, " typedef, ");
  if (decl_spec->extern_p) fprintf (f, " extern, ");
  if (decl_spec->static_p) fprintf (f, " static, ");
  if (decl_spec->auto_p) fprintf (f, " auto, ");
  if (decl_spec->register_p) fprintf (f, " register, ");
  if (decl_spec->thread_local_p) fprintf (f, " thread local, ");
  if (decl_spec->inline_p) fprintf (f, " inline, ");
  if (decl_spec->no_return_p) fprintf (f, " no return, ");
  if (decl_spec->align >= 0) fprintf (f, " align = %d, ", decl_spec->align);
  if (decl_spec->align_node != NULL)
    fprintf (f, " strictest align node %u, ", decl_spec->align_node->uid);
  if (decl_spec->linkage != N_IGNORE)
    fprintf (f, " %s linkage, ", decl_spec->linkage == N_STATIC ? "static" : "extern");
  print_type (c2m_ctx, f, decl_spec->type);
}